

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O2

sc_signed * sc_dt::operator+(sc_signed *__return_storage_ptr__,sc_unsigned *u,long v)

{
  unsigned_long v_00;
  int s;
  sc_digit vd [3];
  
  if (v == 0) {
    sc_signed::sc_signed(__return_storage_ptr__,u);
  }
  else {
    v_00 = -v;
    if ((ulong)v < 0x8000000000000001) {
      v_00 = 0x8000000000000000;
    }
    if (0 < v) {
      v_00 = v;
    }
    s = (uint)(0 < v) * 2 + -1;
    from_uint<unsigned_long>(3,vd,v_00);
    if (u->sgn == 0) {
      sc_signed::sc_signed(__return_storage_ptr__,s,0x40,3,vd,false);
    }
    else {
      add_signed_friend(__return_storage_ptr__,u->sgn,u->nbits,u->ndigits,u->digit,s,0x40,3,vd);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator+(const sc_unsigned &u, long v)
{

  if (v == 0)  // case 2
    return sc_signed(u);

  CONVERT_LONG(v);

  if (u.sgn == SC_ZERO)  // case 1
    return sc_signed(vs, BITS_PER_ULONG, DIGITS_PER_ULONG, vd, false);

  // cases 3 and 4
  return add_signed_friend(u.sgn, u.nbits, u.ndigits, u.digit,
                           vs, BITS_PER_ULONG, DIGITS_PER_ULONG, vd);

}